

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O2

ByteData256 *
cfd::CollectSighashByTx
          (ByteData256 *__return_storage_ptr__,Transaction *transaction,OutPoint *outpoint,
          UtxoData *utxo,SigHashType *sighash_type,Pubkey *pubkey,Script *redeem_script,
          WitnessVersion witness_version,ByteData *param_8,TaprootScriptTree *param_9)

{
  char cVar1;
  undefined4 uVar2;
  Script script_data;
  SigHashType local_ac [12];
  Script local_a0;
  Script local_68;
  
  cfd::core::OutPoint::GetTxid();
  uVar2 = cfd::core::OutPoint::GetVout();
  uVar2 = (**(code **)(*(long *)transaction + 0x10))(transaction,&local_a0,uVar2);
  core::Txid::~Txid((Txid *)&local_a0);
  cfd::core::Script::Script(&local_a0,redeem_script);
  cVar1 = cfd::core::Script::IsEmpty();
  if (cVar1 != '\0') {
    cfd::core::ScriptUtil::CreateP2pkhLockingScript((Pubkey *)&local_68);
    cfd::core::Script::operator=(&local_a0,&local_68);
    core::Script::~Script(&local_68);
  }
  cfd::core::Script::GetData();
  cfd::core::SigHashType::SigHashType(local_ac,sighash_type);
  cfd::core::Transaction::GetSignatureHash
            (__return_storage_ptr__,transaction,uVar2,&local_68,local_ac,&utxo->amount,
             witness_version);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68);
  core::Script::~Script(&local_a0);
  return __return_storage_ptr__;
}

Assistant:

static ByteData256 CollectSighashByTx(
    const Transaction* transaction, const OutPoint& outpoint,
    const UtxoData& utxo, const SigHashType& sighash_type,
    const Pubkey& pubkey, const Script& redeem_script,
    WitnessVersion witness_version, const ByteData*,
    const TaprootScriptTree*) {
  uint32_t index =
      transaction->GetTxInIndex(outpoint.GetTxid(), outpoint.GetVout());
  Script script_data = redeem_script;
  if (script_data.IsEmpty()) {
    script_data = ScriptUtil::CreateP2pkhLockingScript(pubkey);
  }
  auto sighash = transaction->GetSignatureHash(
      index, script_data.GetData(), sighash_type, utxo.amount,
      witness_version);
  return sighash;
}